

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O3

void duckdb_bind_set_cardinality(duckdb_bind_info info,idx_t cardinality,bool is_exact)

{
  void *pvVar1;
  undefined1 *puVar2;
  
  if (info != (duckdb_bind_info)0x0) {
    puVar2 = (undefined1 *)operator_new(0x20);
    *puVar2 = 1;
    *(idx_t *)(puVar2 + 8) = cardinality;
    if (is_exact) {
      puVar2[0x10] = 0;
    }
    else {
      puVar2[0x10] = 1;
      *(idx_t *)(puVar2 + 0x18) = cardinality;
    }
    pvVar1 = *(void **)(*(long *)(info + 0x20) + 0x38);
    *(undefined1 **)(*(long *)(info + 0x20) + 0x38) = puVar2;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
      return;
    }
  }
  return;
}

Assistant:

void duckdb_bind_set_cardinality(duckdb_bind_info info, idx_t cardinality, bool is_exact) {
	if (!info) {
		return;
	}
	auto &bind_info = GetCBindInfo(info);
	if (is_exact) {
		bind_info.bind_data.stats = duckdb::make_uniq<duckdb::NodeStatistics>(cardinality);
	} else {
		bind_info.bind_data.stats = duckdb::make_uniq<duckdb::NodeStatistics>(cardinality, cardinality);
	}
}